

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

MAFSA_automaton MAFSA_automaton_attach(void *ptr_nodes,void *ptr_links,int *error)

{
  MAFSA_automaton pMVar1;
  
  pMVar1 = (MAFSA_automaton)malloc(0x18);
  if (error == (int *)0x0) {
    if (pMVar1 == (MAFSA_automaton)0x0) {
      return (MAFSA_automaton)0x0;
    }
  }
  else {
    *error = 0;
    if (pMVar1 == (MAFSA_automaton)0x0) {
      *error = 1;
      return (MAFSA_automaton)0x0;
    }
  }
  pMVar1->ptr_nodes = (uint32_t *)ptr_nodes;
  pMVar1->ptr_links = (uint32_t *)ptr_links;
  pMVar1->shared = 1;
  return pMVar1;
}

Assistant:

extern MAFSA_automaton MAFSA_automaton_attach(const void *ptr_nodes, const void *ptr_links, int *error)
{
    MAFSA_automaton ret_data = (MAFSA_automaton)malloc(sizeof(struct MAFSA_automaton_struct));
    if (error) *error = 0;

    if (0 == ret_data)
    {
        if (error) *error = MAFSA_ERROR_NOMEM;
        return 0;
    }

    ret_data->ptr_nodes = (uint32_t *) ptr_nodes;
    ret_data->ptr_links = (uint32_t *) ptr_links;
    ret_data->shared = 1;

    return ret_data;
}